

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O2

void __thiscall
Enhedron::Test::Impl::Impl_Results::HumanResults::failByException
          (HumanResults *this,NameStack *context,string *given,NameStack *whenStack,exception *e)

{
  ostream *poVar1;
  char *pcVar2;
  
  indent(this,this->whenDepth_ + (ulong)(this->whenDepth_ == 0));
  poVar1 = ::std::operator<<((this->output_).value,"TEST FAILED WITH EXCEPTION: ");
  pcVar2 = (char *)(**(code **)(*(long *)e + 0x10))(e);
  poVar1 = ::std::operator<<(poVar1,pcVar2);
  ::std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

virtual void failByException(const NameStack& context,
                                     const string& given,
                                     const NameStack& whenStack,
                                     const exception& e) override {
            indent(whenDepth());
            (*output_) << "TEST FAILED WITH EXCEPTION: " << e.what() << endl;
        }